

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.h
# Opt level: O2

bool runtest<wchar_t>(char *inifile,char *expectedfile,
                     basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *os)

{
  __type _Var1;
  wostream *pwVar2;
  _List_node_base *p_Var3;
  allocator<char> local_479;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> expected;
  allocator<char> local_458 [32];
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> actual;
  Ini<wchar_t> ini;
  wostringstream local_3c0 [16];
  wostream local_3b0 [376];
  basic_ifstream<wchar_t,_std::char_traits<wchar_t>_> is;
  wstreambuf local_228 [504];
  
  inipp::Ini<wchar_t>::Ini(&ini);
  std::__cxx11::string::string<std::allocator<char>>((string *)&expected,inifile,local_458);
  std::__cxx11::wostringstream::wostringstream(local_3c0);
  std::wifstream::wifstream((wifstream *)&is,(string *)&expected,_S_in);
  inipp::Ini<wchar_t>::parse(&ini,(basic_istream<wchar_t,_std::char_traits<wchar_t>_> *)&is);
  std::wifstream::~wifstream((wifstream *)&is);
  pwVar2 = std::operator<<((wostream *)local_3c0,">>> ERRORS <<<");
  std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar2);
  p_Var3 = (_List_node_base *)&ini.errors;
  while (p_Var3 = (((_List_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                     *)&p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var3 != (_List_node_base *)&ini.errors) {
    pwVar2 = std::operator<<((wostream *)local_3c0,(wstring *)(p_Var3 + 1));
    std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar2);
  }
  pwVar2 = std::operator<<((wostream *)local_3c0,">>> GENERATE <<<");
  std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar2);
  inipp::Ini<wchar_t>::generate
            (&ini,(basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *)local_3c0);
  pwVar2 = std::operator<<((wostream *)local_3c0,">>> INTERPOLATE <<<");
  std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar2);
  inipp::Ini<wchar_t>::interpolate(&ini);
  inipp::Ini<wchar_t>::generate
            (&ini,(basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *)local_3c0);
  std::__cxx11::wstringbuf::str();
  std::__cxx11::wostringstream::~wostringstream(local_3c0);
  std::__cxx11::string::~string((string *)&expected);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_458,expectedfile,&local_479);
  std::wifstream::wifstream((wifstream *)&is,(string *)local_458,_S_in);
  std::__cxx11::wstringstream::wstringstream((wstringstream *)local_3c0);
  std::wostream::operator<<(local_3b0,local_228);
  std::__cxx11::wstringbuf::str();
  std::__cxx11::wstringstream::~wstringstream((wstringstream *)local_3c0);
  std::wifstream::~wifstream((wifstream *)&is);
  std::__cxx11::string::~string((string *)local_458);
  std::operator<<((wostream *)os,(wstring *)&actual);
  _Var1 = std::operator==(&actual,&expected);
  std::__cxx11::wstring::~wstring((wstring *)&expected);
  std::__cxx11::wstring::~wstring((wstring *)&actual);
  inipp::Ini<wchar_t>::~Ini(&ini);
  return _Var1;
}

Assistant:

static inline bool runtest(const char *inifile, const char *expectedfile, std::basic_ostream<CharT> & os) {
	Ini<CharT> ini;
	auto actual = test(inifile, ini);
	auto expected = read_all<CharT>(expectedfile);
	os << actual;
	return (actual == expected);
}